

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall aeron::ClientConductor::~ClientConductor(ClientConductor *this)

{
  pointer pSVar1;
  pointer pIVar2;
  Image *pIVar3;
  ImageList *pIVar4;
  pointer pSVar5;
  pointer pIVar6;
  long lVar7;
  vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  subscriptions;
  vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  local_48;
  
  this->_vptr_ClientConductor = (_func_int **)&PTR__ClientConductor_0016f740;
  local_48.
  super__Vector_base<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar5 = (this->m_subscriptions).
                super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar1; pSVar5 = pSVar5 + 1) {
    std::
    vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
    ::push_back(&local_48,&pSVar5->m_subscriptionCache);
    std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(pSVar5->m_subscriptionCache).
                super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>);
  }
  pIVar2 = (this->m_lingeringImageLists).
           super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar6 = (this->m_lingeringImageLists).
                super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar2; pIVar6 = pIVar6 + 1) {
    pIVar4 = pIVar6->m_imageList;
    pIVar3 = pIVar4->m_images;
    if (pIVar3 != (Image *)0x0) {
      if (*(long *)&pIVar3[-1].m_positionBitsToShift != 0) {
        lVar7 = *(long *)&pIVar3[-1].m_positionBitsToShift * 0x128;
        do {
          Image::~Image((Image *)((long)pIVar3[-1].m_termBuffers._M_elems + lVar7 + -8));
          lVar7 = lVar7 + -0x128;
        } while (lVar7 != 0);
      }
      operator_delete__(&pIVar3[-1].m_positionBitsToShift);
      pIVar4 = pIVar6->m_imageList;
    }
    operator_delete(pIVar4);
    pIVar6->m_imageList = (ImageList *)0x0;
  }
  DriverProxy::clientClose(this->m_driverProxy);
  std::
  vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  ::~vector(&local_48);
  std::_Function_base::~_Function_base(&(this->m_epochClock).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_onUnavailableCounterHandler).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_onAvailableCounterHandler).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_errorHandler).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_onNewSubscriptionHandler).super__Function_base);
  std::_Function_base::~_Function_base
            (&(this->m_onNewExclusivePublicationHandler).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_onNewPublicationHandler).super__Function_base);
  std::
  _Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
  ::~_Vector_base(&(this->m_lingeringImageLists).
                   super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
                 );
  std::
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  ::~vector(&this->m_lingeringLogBuffers);
  std::
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  ::~vector(&this->m_counters);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::~vector(&this->m_subscriptions);
  std::
  vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
  ::~vector(&this->m_exclusivePublications);
  std::
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  ::~vector(&this->m_publications);
  return;
}

Assistant:

ClientConductor::~ClientConductor()
{
    std::vector<std::shared_ptr<Subscription>> subscriptions;

    std::for_each(m_subscriptions.begin(), m_subscriptions.end(),
        [&subscriptions](SubscriptionStateDefn& entry)
        {
            subscriptions.push_back(entry.m_subscriptionCache);
            entry.m_subscriptionCache.reset();
        });

    std::for_each(m_lingeringImageLists.begin(), m_lingeringImageLists.end(),
        [](ImageListLingerDefn & entry)
        {
            delete[] entry.m_imageList->m_images;
            delete entry.m_imageList;
            entry.m_imageList = nullptr;
        });

    m_driverProxy.clientClose();
}